

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O3

int lre_is_cased(uint32_t c)

{
  BOOL BVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = 0;
  iVar3 = 0x168;
  do {
    uVar2 = (uint)(iVar3 + iVar4) >> 1;
    uVar5 = case_conv_table1[uVar2] >> 0xf;
    if (c < uVar5) {
      iVar3 = uVar2 - 1;
    }
    else {
      if (c < (case_conv_table1[uVar2] >> 8 & 0x7f) + uVar5) {
        return 1;
      }
      iVar4 = uVar2 + 1;
    }
  } while (iVar4 <= iVar3);
  BVar1 = lre_is_in_table(c,unicode_prop_Cased1_table,unicode_prop_Cased1_index,6);
  return BVar1;
}

Assistant:

BOOL lre_is_cased(uint32_t c)
{
    uint32_t v, code, len;
    int idx, idx_min, idx_max;
        
    idx_min = 0;
    idx_max = countof(case_conv_table1) - 1;
    while (idx_min <= idx_max) {
        idx = (unsigned)(idx_max + idx_min) / 2;
        v = case_conv_table1[idx];
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if (c < code) {
            idx_max = idx - 1;
        } else if (c >= code + len) {
            idx_min = idx + 1;
        } else {
            return TRUE;
        }
    }
    return lre_is_in_table(c, unicode_prop_Cased1_table,
                           unicode_prop_Cased1_index,
                           sizeof(unicode_prop_Cased1_index) / 3);
}